

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_file.cc
# Opt level: O0

int by_file_ctrl(X509_LOOKUP *ctx,int cmd,char *argp,long argl,char **ret)

{
  int iVar1;
  char *__name;
  int local_44;
  char *pcStack_40;
  int type;
  char *file;
  char **ret_local;
  long argl_local;
  char *argp_local;
  int cmd_local;
  X509_LOOKUP *ctx_local;
  
  if (cmd == 1) {
    local_44 = (int)argl;
    pcStack_40 = argp;
    if (argl == 3) {
      __name = X509_get_default_cert_file_env();
      pcStack_40 = getenv(__name);
      if (pcStack_40 == (char *)0x0) {
        pcStack_40 = X509_get_default_cert_file();
      }
      local_44 = 1;
    }
    iVar1 = X509_load_cert_crl_file((X509_LOOKUP *)ctx,pcStack_40,local_44);
    if (iVar1 == 0) {
      if (argl == 3) {
        ERR_put_error(0xb,0,0x76,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                      ,0x34);
      }
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = 1;
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int by_file_ctrl(X509_LOOKUP *ctx, int cmd, const char *argp, long argl,
                        char **ret) {
  if (cmd != X509_L_FILE_LOAD) {
    return 0;
  }
  const char *file = argp;
  int type = argl;
  if (argl == X509_FILETYPE_DEFAULT) {
    if ((file = getenv(X509_get_default_cert_file_env())) == NULL) {
      file = X509_get_default_cert_file();
    }
    type = X509_FILETYPE_PEM;
  }
  if (X509_load_cert_crl_file(ctx, file, type) != 0) {
    return 1;
  }
  if (argl == X509_FILETYPE_DEFAULT) {
    OPENSSL_PUT_ERROR(X509, X509_R_LOADING_DEFAULTS);
  }
  return 0;
}